

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void traverse_hplane_csc<PredictionData<double,unsigned_long>,unsigned_long>
               (WorkerForPredictCSC *workspace,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,ExtIsoForest *model_outputs,
               PredictionData<double,_unsigned_long> *prediction_data,unsigned_long *tree_num,
               double *per_tree_depths,size_t curr_tree,bool has_range_penalty)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  pointer puVar5;
  iterator fill_new;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  buffer_cnt;
  iterator cat_coef;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  fill_val;
  iterator st;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> ix_arr;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  double *fill_val_00;
  reference this;
  reference pvVar10;
  unsigned_long *puVar11;
  double *pdVar12;
  pointer puVar13;
  ExtIsoForest *in_RCX;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_RDX;
  WorkerForPredictCSC *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  PredictionData<double,_unsigned_long> *in_R8;
  unsigned_long *in_R9;
  size_t unaff_retaddr;
  double *in_stack_00000008;
  undefined1 in_stack_00000010;
  size_t orig_end;
  size_t split_ix;
  size_t row_3;
  size_t col_1;
  size_t ncols_categ;
  size_t ncols_numeric;
  size_t col;
  double unused;
  size_t row_2;
  size_t row_1;
  size_t row;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb8;
  double *in_stack_fffffffffffffcc0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffcc8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffda0;
  value_type vVar14;
  undefined4 in_stack_fffffffffffffda8;
  value_type in_stack_fffffffffffffdac;
  double *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  double *in_stack_fffffffffffffdc0;
  double *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  unsigned_long *in_stack_fffffffffffffdd8;
  pointer in_stack_fffffffffffffde0;
  double *in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffdf8;
  double *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  MissingAction missing_action;
  undefined8 in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  size_t *in_stack_fffffffffffffe20;
  pointer local_f0;
  ulong uVar15;
  double dVar16;
  int *in_stack_ffffffffffffff30;
  ulong uVar17;
  double *in_stack_ffffffffffffff38;
  size_t end;
  size_t *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 has_range_penalty_00;
  CategSplit in_stack_ffffffffffffffa0;
  undefined3 in_stack_ffffffffffffffa4;
  uint uVar18;
  PredictionData<double,_unsigned_long> *pPVar19;
  
  uVar18 = CONCAT13(in_stack_00000010,in_stack_ffffffffffffffa4) & 0x1ffffff;
  pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                     ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                      (size_type)in_stack_00000008);
  if (pvVar2->hplane_left == 0) {
    for (puVar5 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar5 <= in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish; puVar5 = (pointer)((long)puVar5 + 1)) {
      pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                         ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                          (size_type)in_stack_00000008);
      dVar16 = pvVar2->score;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI,(size_type)puVar5);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[3].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,*pvVar3);
      *pvVar4 = dVar16 + *pvVar4;
    }
    if (in_R8 != (PredictionData<double,_unsigned_long> *)0x0) {
      for (puVar5 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar5 <= in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar5 = (pointer)((long)puVar5 + 1))
      {
        pPVar19 = in_R8;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,(size_type)puVar5);
        (&in_R8->numeric_data)[*pvVar3] = in_stack_00000008;
        in_R8 = pPVar19;
      }
    }
    if (in_R9 != (unsigned_long *)0x0) {
      for (puVar5 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar5 <= in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar5 = (pointer)((long)puVar5 + 1))
      {
        pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                           ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        dVar16 = pvVar2->score;
        puVar11 = in_R9;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,(size_type)puVar5);
        in_R9[*pvVar3] = (unsigned_long)dVar16;
        in_R9 = puVar11;
      }
    }
  }
  else {
    fill_new = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffcb8);
    buffer_cnt = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffcc8._M_current,
                             (difference_type)in_stack_fffffffffffffcc0);
    cat_coef = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffcb8);
    _Var6 = __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)in_stack_fffffffffffffcc8._M_current,
                        (difference_type)in_stack_fffffffffffffcc0);
    fill_val = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffcc8._M_current,
                           (difference_type)in_stack_fffffffffffffcc0);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )in_stack_fffffffffffffcd0._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )in_stack_fffffffffffffcc8._M_current);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffcb8);
    st = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffcb8);
    ix_arr = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+(in_stack_fffffffffffffcc8._M_current,in_stack_fffffffffffffcc0);
    end = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    if ((in_RCX->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      uVar17 = 0;
      while( true ) {
        uVar15 = uVar17;
        pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                           ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar2->col_num);
        if (sVar7 <= uVar17) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x429c59);
        pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                           ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&pvVar2->col_num,uVar15);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x429cca);
        pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                           ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        std::vector<double,_std::allocator<double>_>::operator[](&pvVar2->coef,uVar15);
        pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                           ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        std::vector<double,_std::allocator<double>_>::operator[](&pvVar2->mean,uVar15);
        if (*(int *)&in_RDX[1].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl.
                     super__Vector_impl_data._M_finish != 0) {
          pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                              (size_type)in_stack_00000008);
          std::vector<double,_std::allocator<double>_>::operator[](&pvVar2->fill_val,uVar15);
        }
        add_linear_comb<double,unsigned_long>
                  (in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   (size_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdb8,(unsigned_long *)in_stack_fffffffffffffdf0,
                   (unsigned_long *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00,
                   (double)in_stack_fffffffffffffdb0,
                   (double)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffe08,(MissingAction)in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
                   SUB81((ulong)in_stack_fffffffffffffda0 >> 0x38,0));
        uVar17 = uVar15 + 1;
      }
    }
    else {
      sVar7 = 0;
      dVar16 = 0.0;
      uVar17 = 0;
      while( true ) {
        uVar15 = uVar17;
        pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                           ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar2->col_num);
        if (sVar8 <= uVar17) break;
        pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                           ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        pvVar9 = std::vector<ColType,_std::allocator<ColType>_>::operator[]
                           (&pvVar2->col_type,uVar15);
        if (*pvVar9 == Numeric) {
          puVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x429f48);
          missing_action = (MissingAction)puVar11;
          pdVar12 = (double *)
                    in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar5 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                              (size_type)in_stack_00000008);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&pvVar2->col_num,uVar15);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x429fb9);
          pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                              (size_type)in_stack_00000008);
          std::vector<double,_std::allocator<double>_>::operator[](&pvVar2->coef,sVar7);
          pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                              (size_type)in_stack_00000008);
          std::vector<double,_std::allocator<double>_>::operator[](&pvVar2->mean,sVar7);
          if (*(int *)&in_RDX[1].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl.
                       super__Vector_impl_data._M_finish == 0) {
            fill_val_00 = (double *)&stack0xffffffffffffff38;
          }
          else {
            pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                               ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                                (size_type)in_stack_00000008);
            fill_val_00 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&pvVar2->fill_val,uVar15);
          }
          add_linear_comb<double,unsigned_long>
                    (in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (size_t)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8,(unsigned_long *)in_stack_fffffffffffffdf0,
                     (unsigned_long *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00,
                     (double)in_stack_fffffffffffffdb0,
                     (double)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     fill_val_00,missing_action,pdVar12,puVar5,
                     SUB81((ulong)in_stack_fffffffffffffda0 >> 0x38,0));
          sVar7 = sVar7 + 1;
        }
        else if (*pvVar9 == Categorical) {
          in_stack_fffffffffffffdd8 =
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x42a17f);
          in_stack_fffffffffffffde0 =
               in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          in_stack_fffffffffffffdf0 =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x42a1c0);
          in_stack_fffffffffffffdf8 =
               (in_RCX->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                              (size_type)in_stack_00000008);
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&pvVar2->col_num,uVar15);
          in_stack_fffffffffffffe00 =
               (double *)
               ((long)&(in_stack_fffffffffffffdf8->
                       super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                       super__Vector_impl_data._M_start +
               *pvVar3 * (long)(in_RCX->hplanes).
                               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * 4);
          if (*(int *)((long)&in_RDX[1].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4) == 0) {
            pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                               ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                                (size_type)in_stack_00000008);
            this = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&pvVar2->cat_coef,(size_type)dVar16);
            sVar8 = std::vector<double,_std::allocator<double>_>::size(this);
            in_stack_fffffffffffffdd0 = (undefined4)sVar8;
          }
          else {
            in_stack_fffffffffffffdd0 = 0;
          }
          in_stack_fffffffffffffdd4 = in_stack_fffffffffffffdd0;
          if (*(int *)((long)&in_RDX[1].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4) == 0) {
            pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                               ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                                (size_type)in_stack_00000008);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](&pvVar2->cat_coef,(size_type)dVar16);
            in_stack_fffffffffffffdc0 =
                 std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x42a2cb);
          }
          else {
            in_stack_fffffffffffffdc0 = (double *)0x0;
          }
          in_stack_fffffffffffffdc8 = in_stack_fffffffffffffdc0;
          if (*(int *)((long)&in_RDX[1].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4) == 0x29) {
            pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                               ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                                (size_type)in_stack_00000008);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pvVar2->fill_new,(size_type)dVar16);
            in_stack_fffffffffffffdb0 = (double *)*pvVar4;
          }
          else {
            in_stack_fffffffffffffdb0 = (double *)0x0;
          }
          in_stack_fffffffffffffdb8 = in_stack_fffffffffffffdb0;
          if (*(int *)((long)&in_RDX[1].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4) == 0x29) {
            pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                               ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                                (size_type)in_stack_00000008);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&pvVar2->chosen_cat,(size_type)dVar16);
            in_stack_fffffffffffffdac = *pvVar10;
          }
          else {
            in_stack_fffffffffffffdac = 0;
          }
          pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                              (size_type)in_stack_00000008);
          std::vector<double,_std::allocator<double>_>::operator[](&pvVar2->fill_val,uVar15);
          pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                              (size_type)in_stack_00000008);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&pvVar2->fill_new,(size_type)dVar16);
          add_linear_comb<double>
                    ((size_t *)ix_arr._M_current,(size_t)st._M_current,end,in_stack_ffffffffffffff38
                     ,in_stack_ffffffffffffff30,(int)(sVar7 >> 0x20),(double *)cat_coef._M_current,
                     dVar16,(int)_Var6._M_current,(double *)fill_val._M_current,
                     (double *)fill_new._M_current,buffer_cnt._M_current,in_stack_ffffffffffffff88,
                     (NewCategAction)in_stack_ffffffffffffff90,
                     (MissingAction)in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
                     SUB81(uVar15 >> 0x38,0));
          dVar16 = (double)((long)dVar16 + 1);
        }
        uVar17 = uVar15 + 1;
      }
    }
    has_range_penalty_00 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
    if ((uVar18 & 0x1000000) != 0) {
      for (local_f0 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          has_range_penalty_00 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38),
          local_f0 <=
          in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; local_f0 = (pointer)((long)local_f0 + 1)) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[1].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)local_f0 -
                            (long)in_RDI[1].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        vVar14 = *pvVar4;
        pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                           ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                            (size_type)in_stack_00000008);
        bVar1 = true;
        if (pvVar2->range_low <= vVar14) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &in_RDI[1].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)local_f0 -
                              (long)in_RDI[1].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          dVar16 = *pvVar4;
          pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                              (size_type)in_stack_00000008);
          bVar1 = pvVar2->range_high <= dVar16 && dVar16 != pvVar2->range_high;
        }
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,(size_type)local_f0);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[3].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar3);
        *pvVar4 = *pvVar4 - (double)bVar1;
      }
    }
    puVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x42a67e);
    pdVar12 = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x42a697);
    puVar5 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar13 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pvVar2 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                       ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                        (size_type)in_stack_00000008);
    puVar13 = (pointer)divide_subset_split(puVar11,pdVar12,(size_t)puVar5,(size_t)puVar13,
                                           pvVar2->split_point);
    puVar5 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar13) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((long)puVar13 - 1);
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                 (size_type)in_stack_00000008);
      traverse_hplane_csc<PredictionData<double,unsigned_long>,unsigned_long>
                (in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                 (double *)CONCAT44(uVar18,in_stack_ffffffffffffffa0),unaff_retaddr,
                 (bool)has_range_penalty_00);
    }
    if (puVar13 <= puVar5) {
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar13;
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RSI,
                 (size_type)in_stack_00000008);
      traverse_hplane_csc<PredictionData<double,unsigned_long>,unsigned_long>
                (in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                 (double *)CONCAT44(uVar18,in_stack_ffffffffffffffa0),unaff_retaddr,
                 (bool)has_range_penalty_00);
    }
  }
  return;
}

Assistant:

void traverse_hplane_csc(WorkerForPredictCSC      &workspace,
                         std::vector<IsoHPlane>   &hplanes,
                         ExtIsoForest             &model_outputs,
                         PredictionData           &prediction_data,
                         sparse_ix *restrict      tree_num,
                         double *restrict         per_tree_depths,
                         size_t                   curr_tree,
                         bool                     has_range_penalty)
{
    // if (hplanes[curr_tree].score >= 0)
    if (unlikely(hplanes[curr_tree].hplane_left == 0))
    {
        for (size_t row = workspace.st; row <= workspace.end; row++)
            workspace.depths[workspace.ix_arr[row]] += hplanes[curr_tree].score;
        if (unlikely(tree_num != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                tree_num[workspace.ix_arr[row]] = curr_tree;
        if (unlikely(per_tree_depths != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                per_tree_depths[workspace.ix_arr[row]] = hplanes[curr_tree].score;
        return;
    }

    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    std::fill(workspace.comb_val.begin(), workspace.comb_val.begin() + (workspace.end - workspace.st + 1), 0.);
    double unused;

    if (likely(prediction_data.categ_data == NULL))
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
            add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                            hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                            prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                            hplanes[curr_tree].coef[col], (double)0, hplanes[curr_tree].mean[col],
                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                            model_outputs.missing_action, NULL, NULL, false);
    }

    else
    {
        size_t ncols_numeric = 0;
        size_t ncols_categ = 0;
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
        {
            switch (hplanes[curr_tree].col_type[col])
            {
                case Numeric:
                {
                    add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                                    hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                    (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                    model_outputs.missing_action, NULL, NULL, false);
                    ncols_numeric++;
                    break;
                }

                case Categorical:
                {
                    add_linear_comb<double>(
                                    workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                    prediction_data.categ_data + hplanes[curr_tree].col_num[col] * prediction_data.nrows,
                                    (model_outputs.cat_split_type == SubSet)? (int)hplanes[curr_tree].cat_coef[ncols_categ].size() : 0,
                                    (model_outputs.cat_split_type == SubSet)? hplanes[curr_tree].cat_coef[ncols_categ].data() : NULL,
                                    (model_outputs.cat_split_type == SingleCateg)? hplanes[curr_tree].fill_new[ncols_categ] : 0.,
                                    (model_outputs.cat_split_type == SingleCateg)? hplanes[curr_tree].chosen_cat[ncols_categ] : 0,
                                    hplanes[curr_tree].fill_val[col], hplanes[curr_tree].fill_new[ncols_categ], NULL, NULL,
                                    model_outputs.new_cat_action, model_outputs.missing_action, model_outputs.cat_split_type, false);
                    ncols_categ++;
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }

    if (has_range_penalty)
    {
        for (size_t row = workspace.st; row <= workspace.end; row++)
            workspace.depths[workspace.ix_arr[row]]
                -=
            (workspace.comb_val[row - workspace.st] < hplanes[curr_tree].range_low) ||
            (workspace.comb_val[row - workspace.st] > hplanes[curr_tree].range_high);
    }

    /* divide data */
    size_t split_ix = divide_subset_split(workspace.ix_arr.data(), workspace.comb_val.data(),
                                          workspace.st, workspace.end, hplanes[curr_tree].split_point);

    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (split_ix > workspace.st)
    {
        workspace.end = split_ix - 1;
        traverse_hplane_csc(workspace,
                            hplanes,
                            model_outputs,
                            prediction_data,
                            tree_num,
                            per_tree_depths,
                            hplanes[curr_tree].hplane_left,
                            has_range_penalty);
    }

    if (split_ix <= orig_end)
    {
        workspace.st  = split_ix;
        workspace.end = orig_end;
        traverse_hplane_csc(workspace,
                            hplanes,
                            model_outputs,
                            prediction_data,
                            tree_num,
                            per_tree_depths,
                            hplanes[curr_tree].hplane_right,
                            has_range_penalty);
    }
}